

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorProto::MergeFrom(DescriptorProto *this,DescriptorProto *from)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  FieldDescriptorProto *pFVar5;
  void **ppvVar6;
  DescriptorProto *from_00;
  EnumDescriptorProto *from_01;
  DescriptorProto_ExtensionRange *from_02;
  LogMessage *other;
  FieldDescriptorProto *pFVar7;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  DescriptorProto_ExtensionRange *this_02;
  string *psVar8;
  MessageOptions *pMVar9;
  long lVar10;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x8f0);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->field_).super_RepeatedPtrFieldBase,
             (from->field_).super_RepeatedPtrFieldBase.current_size_ +
             (this->field_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->field_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      pFVar5 = (FieldDescriptorProto *)(from->field_).super_RepeatedPtrFieldBase.elements_[lVar10];
      iVar3 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->field_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar6 = (this->field_).super_RepeatedPtrFieldBase.elements_;
        (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        pFVar7 = (FieldDescriptorProto *)ppvVar6[iVar3];
      }
      else {
        iVar3 = (this->field_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->field_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->field_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        pFVar7 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
        ppvVar6 = (this->field_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
        (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar6[iVar3] = pFVar7;
      }
      FieldDescriptorProto::MergeFrom(pFVar7,pFVar5);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->field_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->extension_).super_RepeatedPtrFieldBase,
             (from->extension_).super_RepeatedPtrFieldBase.current_size_ +
             (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      pFVar5 = (FieldDescriptorProto *)
               (from->extension_).super_RepeatedPtrFieldBase.elements_[lVar10];
      iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar6 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        pFVar7 = (FieldDescriptorProto *)ppvVar6[iVar3];
      }
      else {
        iVar3 = (this->extension_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->extension_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        pFVar7 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
        ppvVar6 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar6[iVar3] = pFVar7;
      }
      FieldDescriptorProto::MergeFrom(pFVar7,pFVar5);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->nested_type_).super_RepeatedPtrFieldBase,
             (from->nested_type_).super_RepeatedPtrFieldBase.current_size_ +
             (this->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      from_00 = (DescriptorProto *)(from->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar10]
      ;
      iVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar6 = (this->nested_type_).super_RepeatedPtrFieldBase.elements_;
        (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_00 = (DescriptorProto *)ppvVar6[iVar3];
      }
      else {
        iVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar6 = (this->nested_type_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar6[iVar3] = this_00;
      }
      MergeFrom(this_00,from_00);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             (from->enum_type_).super_RepeatedPtrFieldBase.current_size_ +
             (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      from_01 = (EnumDescriptorProto *)
                (from->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar10];
      iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
        (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_01 = (EnumDescriptorProto *)ppvVar6[iVar3];
      }
      else {
        iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
        ppvVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar6[iVar3] = this_01;
      }
      EnumDescriptorProto::MergeFrom(this_01,from_01);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->extension_range_).super_RepeatedPtrFieldBase,
             (from->extension_range_).super_RepeatedPtrFieldBase.current_size_ +
             (this->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      from_02 = (DescriptorProto_ExtensionRange *)
                (from->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar10];
      iVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar6 = (this->extension_range_).super_RepeatedPtrFieldBase.elements_;
        (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_02 = (DescriptorProto_ExtensionRange *)ppvVar6[iVar3];
      }
      else {
        iVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_02 = internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>::
                  New();
        ppvVar6 = (this->extension_range_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar6[iVar3] = this_02;
      }
      DescriptorProto_ExtensionRange::MergeFrom(this_02,from_02);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar2 = (byte)from->_has_bits_[0];
  if (bVar2 != 0) {
    if ((bVar2 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar8 = (string *)operator_new(0x20);
        (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
        psVar8->_M_string_length = 0;
        (psVar8->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar8;
      }
      std::__cxx11::string::_M_assign((string *)this->name_);
    }
    if ((from->_has_bits_[0] & 0x40) != 0) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
      if (this->options_ == (MessageOptions *)0x0) {
        pMVar9 = (MessageOptions *)operator_new(0x68);
        MessageOptions::MessageOptions(pMVar9);
        this->options_ = pMVar9;
      }
      pMVar9 = from->options_;
      if (pMVar9 == (MessageOptions *)0x0) {
        pMVar9 = *(MessageOptions **)(default_instance_ + 0x90);
      }
      MessageOptions::MergeFrom(this->options_,pMVar9);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void DescriptorProto::MergeFrom(const DescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  field_.MergeFrom(from.field_);
  extension_.MergeFrom(from.extension_);
  nested_type_.MergeFrom(from.nested_type_);
  enum_type_.MergeFrom(from.enum_type_);
  extension_range_.MergeFrom(from.extension_range_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::MessageOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}